

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O0

uint64_t chatter::platform::NetToHost64(uint64_t *net)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int x;
  uint64_t *net_local;
  
  uVar1 = ntohl((uint32_t)*net);
  uVar2 = ntohl((uint32_t)(*net >> 0x20));
  return CONCAT44(uVar1,uVar2);
}

Assistant:

uint64_t NetToHost64(const uint64_t& net)
{
    int x = 1;
    if (*(char*)&x == x)
        /* little endian */
        return ((((uint64_t)ntohl(net)) << 32) + ntohl(net >> 32));

    else
        return net;
}